

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

void __thiscall
wasm::MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
          (MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
           *this,Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *u
          )

{
  Err *pEVar1;
  HeapTypeT *__t;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *u_local;
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *this_local;
  
  pEVar1 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::getErr
                     (u);
  if (pEVar1 == (Err *)0x0) {
    __t = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
          operator*(u);
    std::
    variant<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,wasm::None,wasm::Err>
    ::
    variant<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT&,void,void,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,void>
              ((variant<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,wasm::None,wasm::Err>
                *)this,__t);
  }
  else {
    pEVar1 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
             getErr(u);
    std::
    variant<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,wasm::None,wasm::Err>
    ::variant<wasm::Err&,void,void,wasm::Err,void>
              ((variant<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,wasm::None,wasm::Err>
                *)this,pEVar1);
  }
  return;
}

Assistant:

MaybeResult(Result<U>&& u)
    : val(u.getErr() ? std::variant<T, None, Err>{*u.getErr()}
                     : std::variant<T, None, Err>{*u}) {}